

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O0

Resource res_getTableItemByIndex_63(ResourceData *pResData,Resource table,int32_t indexR,char **key)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Resource RVar5;
  ushort *puVar6;
  int *piVar7;
  char *local_70;
  char *local_68;
  char *local_60;
  int32_t *p_2;
  uint16_t *p_1;
  Resource *p32;
  uint16_t *p;
  int32_t length;
  uint32_t offset;
  char **key_local;
  int32_t indexR_local;
  Resource table_local;
  ResourceData *pResData_local;
  
  uVar3 = table & 0xfffffff;
  if (-1 < indexR) {
    uVar4 = table >> 0x1c;
    if (uVar4 == 2) {
      if (uVar3 != 0) {
        puVar6 = (ushort *)(pResData->pRoot + uVar3);
        uVar3 = (uint)*puVar6;
        if (indexR < (int)uVar3) {
          if (key != (char **)0x0) {
            if ((int)(uint)puVar6[(long)indexR + 1] < pResData->localKeyLimit) {
              local_60 = (char *)((long)pResData->pRoot + (long)(int)(uint)puVar6[(long)indexR + 1])
              ;
            }
            else {
              local_60 = pResData->poolBundleKeys +
                         ((long)(int)(uint)puVar6[(long)indexR + 1] - (long)pResData->localKeyLimit)
              ;
            }
            *key = local_60;
          }
          return *(Resource *)
                  (puVar6 + (long)(int)uVar3 +
                            (long)(int)((uVar3 ^ 0xffffffff) & 1) + (long)indexR * 2 + 1);
        }
      }
    }
    else if (uVar4 == 4) {
      if (uVar3 != 0) {
        piVar7 = pResData->pRoot + uVar3;
        iVar2 = *piVar7;
        if (indexR < iVar2) {
          if (key != (char **)0x0) {
            if (piVar7[(long)indexR + 1] < 0) {
              local_70 = pResData->poolBundleKeys + (int)(piVar7[(long)indexR + 1] & 0x7fffffff);
            }
            else {
              local_70 = (char *)((long)pResData->pRoot + (long)piVar7[(long)indexR + 1]);
            }
            *key = local_70;
          }
          return piVar7[(long)(iVar2 + indexR) + 1];
        }
      }
    }
    else if (uVar4 == 5) {
      puVar6 = pResData->p16BitUnits + uVar3;
      uVar1 = *puVar6;
      if (indexR < (int)(uint)uVar1) {
        if (key != (char **)0x0) {
          if ((int)(uint)puVar6[(long)indexR + 1] < pResData->localKeyLimit) {
            local_68 = (char *)((long)pResData->pRoot + (long)(int)(uint)puVar6[(long)indexR + 1]);
          }
          else {
            local_68 = pResData->poolBundleKeys +
                       ((long)(int)(uint)puVar6[(long)indexR + 1] - (long)pResData->localKeyLimit);
          }
          *key = local_68;
        }
        RVar5 = makeResourceFrom16(pResData,(uint)puVar6[(long)(int)((uint)uVar1 + indexR) + 1]);
        return RVar5;
      }
    }
  }
  return 0xffffffff;
}

Assistant:

U_CAPI Resource U_EXPORT2
res_getTableItemByIndex(const ResourceData *pResData, Resource table,
                        int32_t indexR, const char **key) {
    uint32_t offset=RES_GET_OFFSET(table);
    int32_t length;
    if (indexR < 0) {
        return RES_BOGUS;
    }
    switch(RES_GET_TYPE(table)) {
    case URES_TABLE: {
        if (offset != 0) { /* empty if offset==0 */
            const uint16_t *p= (const uint16_t *)(pResData->pRoot+offset);
            length=*p++;
            if(indexR<length) {
                const Resource *p32=(const Resource *)(p+length+(~length&1));
                if(key!=NULL) {
                    *key=RES_GET_KEY16(pResData, p[indexR]);
                }
                return p32[indexR];
            }
        }
        break;
    }
    case URES_TABLE16: {
        const uint16_t *p=pResData->p16BitUnits+offset;
        length=*p++;
        if(indexR<length) {
            if(key!=NULL) {
                *key=RES_GET_KEY16(pResData, p[indexR]);
            }
            return makeResourceFrom16(pResData, p[length+indexR]);
        }
        break;
    }
    case URES_TABLE32: {
        if (offset != 0) { /* empty if offset==0 */
            const int32_t *p= pResData->pRoot+offset;
            length=*p++;
            if(indexR<length) {
                if(key!=NULL) {
                    *key=RES_GET_KEY32(pResData, p[indexR]);
                }
                return (Resource)p[length+indexR];
            }
        }
        break;
    }
    default:
        break;
    }
    return RES_BOGUS;
}